

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

bool anon_unknown.dwarf_1ee5cf::checkPixels<half>
               (Array2D<half> *ph,int lx,int rx,int ly,int ry,int width)

{
  float *pfVar1;
  float fVar2;
  short sVar3;
  bool bVar4;
  ushort uVar5;
  ostream *poVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  bool local_72;
  long local_68;
  
  local_72 = ry < ly;
  if (ly <= ry) {
    lVar11 = (long)ly * 2;
    iVar8 = ly * width;
    local_68 = (long)ly;
    do {
      lVar12 = (long)lx;
      iVar10 = lx;
      bVar4 = rx < lx;
      if (lx <= rx) {
        do {
          fVar2 = *(float *)((long)&half::_toFloat +
                            (ulong)*(unsigned_short *)
                                    ((long)&ph->_data[lVar12]._h + ph->_sizeY * lVar11) * 4);
          iVar9 = (iVar8 + iVar10) % 0x801;
          fVar13 = (float)iVar9;
          if (iVar9 == 0) {
            uVar5 = (ushort)((uint)fVar13 >> 0x10);
          }
          else {
            sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar13 >> 0x17) * 2);
            if (sVar3 == 0) {
              uVar5 = half::convert((int)fVar13);
            }
            else {
              uVar5 = sVar3 + (short)(((uint)fVar13 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar13 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)uVar5 * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_68);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
            poVar6 = (ostream *)
                     operator<<(poVar6,(half)*(unsigned_short *)
                                              ((long)&ph->_data[lVar12]._h + ph->_sizeY * lVar11));
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", should be ",0xc);
            plVar7 = (long *)std::ostream::operator<<(poVar6,iVar9);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            std::ostream::flush();
            std::ostream::flush();
            if (!bVar4) {
              return local_72;
            }
            break;
          }
          bVar4 = rx <= lVar12;
          iVar10 = iVar10 + 1;
          lVar12 = lVar12 + 1;
        } while (rx + 1 != iVar10);
      }
      lVar12 = local_68 + 1;
      local_72 = ry <= local_68;
      lVar11 = lVar11 + 2;
      iVar8 = iVar8 + width;
      local_68 = lVar12;
    } while (ry + 1 != (int)lVar12);
  }
  return local_72;
}

Assistant:

bool checkPixels (Array2D<T> &ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T>(((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl << flush;
                return false;
            }
    return true;
}